

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb_dump.cc
# Opt level: O0

int scan_docs(fdb_kvs_handle *db,dump_option *opt,char *kvs_name)

{
  fdb_status fVar1;
  size_t in_RDX;
  long in_RSI;
  fdb_kvs_handle *in_RDI;
  fdb_doc *fdoc;
  fdb_doc **in_stack_00000020;
  fdb_status fs;
  fdb_iterator *fit;
  uint64_t offset;
  dump_option *in_stack_00000068;
  uint64_t in_stack_00000070;
  char *in_stack_00000078;
  fdb_kvs_handle *in_stack_00000080;
  fdb_iterator *in_stack_ffffffffffffffa8;
  fdb_iterator *iterator;
  void *in_stack_ffffffffffffffb0;
  fdb_iterator *in_stack_ffffffffffffffb8;
  size_t keylen;
  fdb_doc *doc;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  fdb_iterator *local_30;
  uint64_t local_28;
  
  doc = (fdb_doc *)0x0;
  if (*(long *)(in_RSI + 8) == 0) {
    if (*(int *)(in_RSI + 0x24) == 1) {
      iterator = (fdb_iterator *)((ulong)in_stack_ffffffffffffffa8 & 0xffffffff00000000);
      fVar1 = fdb_iterator_init(in_RDI,&local_30,(void *)0x0,0,(void *)0x0,0,0);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        return -2;
      }
      do {
        fVar1 = fdb_iterator_get(fit,in_stack_00000020);
        if (fVar1 == FDB_RESULT_SUCCESS) {
          local_28 = doc->offset;
          print_doc(in_stack_00000080,in_stack_00000078,in_stack_00000070,in_stack_00000068);
          fdb_doc_free((fdb_doc *)0x104d03);
          doc = (fdb_doc *)0x0;
        }
        fVar1 = fdb_iterator_next(iterator);
      } while (fVar1 == FDB_RESULT_SUCCESS);
      fdb_iterator_close(in_stack_ffffffffffffffb8);
    }
    else if (*(int *)(in_RSI + 0x24) == 2) {
      fVar1 = fdb_iterator_sequence_init(in_RDI,&local_30,0,0xffffffffffffffff,0);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        return -2;
      }
      do {
        fVar1 = fdb_iterator_get(fit,in_stack_00000020);
        if (fVar1 == FDB_RESULT_SUCCESS) {
          local_28 = doc->offset;
          print_doc(in_stack_00000080,in_stack_00000078,in_stack_00000070,in_stack_00000068);
          fdb_doc_free((fdb_doc *)0x104db4);
          doc = (fdb_doc *)0x0;
        }
        fVar1 = fdb_iterator_next(in_stack_ffffffffffffffa8);
      } while (fVar1 == FDB_RESULT_SUCCESS);
      fdb_iterator_close(in_stack_ffffffffffffffb8);
    }
  }
  else {
    keylen = *(size_t *)(in_RSI + 8);
    strnlen(*(char **)(in_RSI + 8),0xff80);
    fdb_doc_create((fdb_doc **)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),doc,
                   keylen,in_stack_ffffffffffffffb0,0,(void *)0x104bc2,in_RDX);
    fVar1 = fdb_get(in_RDI,doc);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      local_28 = doc->offset;
      print_doc(in_stack_00000080,in_stack_00000078,in_stack_00000070,in_stack_00000068);
    }
    else {
      fVar1 = fdb_get_metaonly(in_RDI,doc);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        return -1;
      }
      local_28 = doc->offset;
      print_doc(in_stack_00000080,in_stack_00000078,in_stack_00000070,in_stack_00000068);
    }
    fdb_doc_free((fdb_doc *)0x104c61);
  }
  return 0;
}

Assistant:

int scan_docs(fdb_kvs_handle *db, struct dump_option *opt, char *kvs_name)
{
    uint64_t offset;
    fdb_iterator *fit;
    fdb_status fs;
    fdb_doc *fdoc = NULL;

    if (opt->one_key) {
        fdb_doc_create(&fdoc, opt->one_key,
                       strnlen(opt->one_key,FDB_MAX_KEYLEN), NULL, 0, NULL, 0);
       fs = fdb_get(db, fdoc);
       if (fs == FDB_RESULT_SUCCESS) {
           offset = fdoc->offset;
           print_doc(db, kvs_name, offset, opt);
       } else { // MB-22046: Also need to be able to print deleted doc
           fs = fdb_get_metaonly(db, fdoc);
           if (fs == FDB_RESULT_SUCCESS) {
               offset = fdoc->offset;
               print_doc(db, kvs_name, offset, opt);
           } else {
               return -1;
           }
       }
       fdb_doc_free(fdoc);
       fdoc = NULL;
    } else if (opt->scan_mode == SCAN_BY_KEY) {
        fs = fdb_iterator_init(db, &fit, NULL, 0, NULL, 0, 0x0);
        if (fs != FDB_RESULT_SUCCESS) {
            return -2;
        }
        do {
            if (fdb_iterator_get(fit, &fdoc) == FDB_RESULT_SUCCESS) {
                offset = fdoc->offset;
                print_doc(db, kvs_name, offset, opt);
                fdb_doc_free(fdoc);
                fdoc = NULL;
            }
        } while(fdb_iterator_next(fit) == FDB_RESULT_SUCCESS);
        fdb_iterator_close(fit);
    } else if (opt->scan_mode == SCAN_BY_SEQ) {
        fs = fdb_iterator_sequence_init(db, &fit, 0, -1, 0x0);
        if (fs != FDB_RESULT_SUCCESS) {
            return -2;
        }
        do {
            if (fdb_iterator_get(fit, &fdoc) == FDB_RESULT_SUCCESS) {
                offset = fdoc->offset;
                print_doc(db, kvs_name, offset, opt);
                fdb_doc_free(fdoc);
                fdoc = NULL;
            }
        } while(fdb_iterator_next(fit) == FDB_RESULT_SUCCESS);
        fdb_iterator_close(fit);
    }

    return 0;
}